

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O0

void __thiscall Parser::CheckIfImportOrExportStatementValidHere(Parser *this)

{
  bool bVar1;
  ParseNodeFnc *this_00;
  ParseNodeFnc *curFunc;
  Parser *this_local;
  
  this_00 = GetCurrentFunctionNode(this);
  if ((this_00->super_ParseNode).nop == knopFncDecl) {
    bVar1 = ParseNodeFnc::IsModule(this_00);
    if (bVar1) {
      if ((((this->m_currentBlockInfo->pnodeBlock == this_00->pnodeBodyScope) &&
           ((this->m_grfscr & 0x800) != 0x800)) && (this->m_tryCatchOrFinallyDepth == 0)) &&
         ((this->m_disallowImportExportStmt & 1U) == 0)) {
        return;
      }
      Error(this,-0x7ff5fbc2,L"",L"");
    }
  }
  Error(this,-0x7ff5fbb3,L"",L"");
}

Assistant:

void Parser::CheckIfImportOrExportStatementValidHere()
{
    ParseNodeFnc * curFunc = GetCurrentFunctionNode();

    if (curFunc->nop != knopFncDecl || !curFunc->IsModule())
    {
        Error(ERRModuleImportOrExportInScript);
    }

    if (this->m_currentBlockInfo->pnodeBlock != curFunc->pnodeBodyScope
        || (this->m_grfscr & fscrEvalCode) == fscrEvalCode
        || this->m_tryCatchOrFinallyDepth != 0
        || this->m_disallowImportExportStmt)
    {
        Error(ERRInvalidModuleImportOrExport);
    }
}